

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O1

Collimator * __thiscall imrt::Collimator::operator=(Collimator *this,Collimator *c)

{
  int iVar1;
  
  std::
  _Rb_tree<double,_std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::operator=((_Rb_tree<double,_std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
               *)this,(_Rb_tree<double,_std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>,_std::_Select1st<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<double,_std::allocator<double>_>_>_>_>
                       *)c);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>_>
  ::operator=(&(this->angle_coord)._M_t,&(c->angle_coord)._M_t);
  std::vector<double,_std::allocator<double>_>::operator=(&this->xcoord,&c->xcoord);
  std::vector<double,_std::allocator<double>_>::operator=(&this->ycoord,&c->ycoord);
  iVar1 = c->xdim;
  this->nb_beamlets = c->nb_beamlets;
  this->xdim = iVar1;
  this->ydim = c->ydim;
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ::operator=(&(this->angle_row_beam_active)._M_t,&(c->angle_row_beam_active)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::operator=(&(this->nb_angle_beamlets)._M_t,&(c->nb_angle_beamlets)._M_t);
  if (this != c) {
    std::__cxx11::list<int,std::allocator<int>>::_M_assign_dispatch<std::_List_const_iterator<int>>
              ((list<int,std::allocator<int>> *)&this->angles,
               (c->angles).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
               super__List_node_base._M_next,&c->angles);
  }
  this->n_angles = c->n_angles;
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&this->coord_files,&c->coord_files);
  return this;
}

Assistant:

Collimator& Collimator::operator=(Collimator& c){
    beam_coord=c.beam_coord;
    angle_coord=c.angle_coord;
    xcoord=c.xcoord;
    ycoord=c.ycoord;
    nb_beamlets=c.nb_beamlets;
    xdim=c.xdim;
    ydim=c.ydim;
    angle_row_beam_active=c.angle_row_beam_active;
    nb_angle_beamlets=c.nb_angle_beamlets;
    angles=c.angles;
    n_angles=c.n_angles;
    coord_files=c.coord_files;
    return(*this);
  }